

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,pluralise *pluraliser)

{
  ostream *poVar1;
  pluralise *pluraliser_local;
  ostream *os_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(os,pluraliser->m_count);
  poVar1 = std::operator<<(poVar1,' ');
  std::operator<<(poVar1,(string *)&pluraliser->m_label);
  if (pluraliser->m_count != 1) {
    std::operator<<(os,'s');
  }
  return os;
}

Assistant:

std::ostream &operator << (std::ostream &os, pluralise const &pluraliser) {
        os << pluraliser.m_count << ' ' << pluraliser.m_label;
        if (pluraliser.m_count != 1)
            os << 's';
        return os;
    }